

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar6;
  undefined1 uVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  uint6 uVar15;
  ulong uVar16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  UWORD8 aUVar21 [16];
  long lVar22;
  UWORD8 *pUVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar46;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar69;
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar71;
  undefined1 auVar53 [16];
  short sVar60;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar70;
  short sVar72;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined4 uVar73;
  short sVar92;
  short sVar93;
  undefined1 auVar74 [16];
  short sVar91;
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined4 uVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined4 uVar101;
  undefined4 uVar105;
  undefined1 in_XMM5 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar109;
  undefined1 in_XMM8 [16];
  undefined1 auVar108 [16];
  short sVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  UWORD8 *local_90;
  short local_78;
  short sStack_76;
  undefined1 auVar37 [16];
  undefined1 auVar43 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [16];
  undefined1 auVar39 [16];
  undefined1 auVar45 [16];
  undefined1 auVar51 [16];
  undefined1 auVar57 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar89 [16];
  undefined1 auVar78 [16];
  undefined1 auVar90 [16];
  undefined1 auVar79 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  
  aUVar21 = IHEVCE_SHUFFLEMASKY7;
  auVar35 = _DAT_0016c100;
  auVar34 = pshuflw(ZEXT416((uint)gai4_ihevc_ang_table[mode]),
                    ZEXT416((uint)gai4_ihevc_ang_table[mode]),0);
  auVar80._0_2_ = auVar34._0_2_;
  sVar91 = auVar34._2_2_;
  if (nt == 4) {
    auVar80._2_2_ = sVar91 * 2;
    auVar80._4_2_ = auVar80._0_2_ * 3;
    auVar80._6_2_ = sVar91 * 4;
    auVar80._8_2_ = auVar80._0_2_ * 5;
    auVar80._10_2_ = sVar91 * 6;
    auVar80._12_2_ = auVar80._0_2_ * 7;
    auVar80._14_2_ = sVar91 * 8;
    auVar47 = pmovsxbw(in_XMM2,0x1c1f1e1f1c1f1e1f);
    auVar47 = auVar47 & auVar80;
    auVar74 = psraw(auVar80,4);
    auVar74 = auVar74 & _DAT_0016c110;
    auVar35 = pmovsxbw(auVar34,0xe0e0e0e0e0e0e0e);
    auVar34 = pmovsxbw(auVar74,0x2020202020202020);
    auVar76._0_2_ = auVar34._0_2_ - auVar47._0_2_;
    sVar91 = auVar34._2_2_ - auVar47._2_2_;
    sVar92 = auVar34._4_2_ - auVar47._4_2_;
    sVar93 = auVar34._6_2_ - auVar47._6_2_;
    uVar8 = CONCAT22(auVar34._8_2_ - auVar47._8_2_,sVar93);
    auVar77._0_9_ = (unkuint9)uVar8 << 0x30;
    uVar15 = CONCAT24(auVar34._10_2_ - auVar47._10_2_,uVar8);
    auVar17._6_5_ = 0;
    auVar17._0_6_ = uVar15;
    auVar78._0_11_ = auVar17 << 0x30;
    uVar16 = CONCAT26(auVar34._12_2_ - auVar47._12_2_,uVar15);
    auVar19._8_5_ = 0;
    auVar19._0_8_ = uVar16;
    auVar79._0_13_ = auVar19 << 0x30;
    uVar6 = (undefined1)sVar91;
    uVar7 = (undefined1)sVar92;
    auVar79._14_2_ =
         (undefined2)(CONCAT19(auVar47[7],CONCAT18((char)((ushort)sVar93 >> 8),uVar16)) >> 0x40);
    auVar79[0xd] = auVar47[6];
    auVar78._12_4_ = (undefined4)(CONCAT37(auVar79._13_3_,CONCAT16((char)sVar93,uVar15)) >> 0x30);
    auVar78[0xb] = auVar47[5];
    auVar77._10_6_ =
         (undefined6)(CONCAT55(auVar78._11_5_,CONCAT14((char)((ushort)sVar92 >> 8),uVar8)) >> 0x20);
    auVar77[9] = auVar47[4];
    auVar76._8_8_ = (undefined8)(CONCAT73(auVar77._9_7_,CONCAT12(uVar7,sVar93)) >> 0x10);
    auVar76[7] = auVar47[3];
    auVar76[6] = (char)((ushort)sVar91 >> 8);
    auVar76[5] = auVar47[2];
    auVar76[4] = uVar6;
    auVar76[3] = auVar47[1];
    auVar76[2] = (char)((ushort)auVar76._0_2_ >> 8);
    auVar75._2_14_ = auVar76._2_14_;
    auVar75[0] = (undefined1)auVar76._0_2_;
    auVar75[1] = auVar47[0];
    auVar34 = pshuflw(auVar47,auVar75,0);
    uVar46 = auVar34._0_4_;
    auVar108._4_4_ = uVar46;
    auVar108._0_4_ = uVar46;
    auVar108._8_4_ = uVar46;
    auVar108._12_4_ = uVar46;
    auVar34 = pshuflw(auVar34,ZEXT216(CONCAT11(auVar47[2],uVar6)),0);
    uVar46 = auVar34._0_4_;
    auVar107._4_4_ = uVar46;
    auVar107._0_4_ = uVar46;
    auVar107._8_4_ = uVar46;
    auVar107._12_4_ = uVar46;
    auVar34 = pshuflw(auVar34,ZEXT216(CONCAT11(auVar47[4],uVar7)),0);
    uVar46 = auVar34._0_4_;
    auVar106._4_4_ = uVar46;
    auVar106._0_4_ = uVar46;
    auVar106._8_4_ = uVar46;
    auVar106._12_4_ = uVar46;
    auVar34 = pshuflw(auVar34,ZEXT216(CONCAT11(auVar47[6],(char)sVar93)),0);
    uVar46 = auVar34._0_4_;
    auVar102._4_4_ = uVar46;
    auVar102._0_4_ = uVar46;
    auVar102._8_4_ = uVar46;
    auVar102._12_4_ = uVar46;
    auVar34 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar35._0_2_ - auVar74._0_2_) + -8),_DAT_0016c100);
    auVar34 = pmaddubsw(auVar34,auVar108);
    auVar80 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar35._2_2_ - auVar74._2_2_) + -8),_DAT_0016c100);
    auVar47 = pmaddubsw(auVar80,auVar107);
    auVar80 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar35._4_2_ - auVar74._4_2_) + -8),_DAT_0016c100);
    auVar80 = pmaddubsw(auVar80,auVar106);
    auVar35 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar35._6_2_ - auVar74._6_2_) + -8),_DAT_0016c100);
    auVar35 = pmaddubsw(auVar35,auVar102);
    auVar103 = pmovsxbw(auVar102,0x1010101010101010);
    sVar91 = auVar103._0_2_;
    auVar74._0_2_ = auVar34._0_2_ + sVar91;
    sVar92 = auVar103._2_2_;
    auVar74._2_2_ = auVar34._2_2_ + sVar92;
    sVar93 = auVar103._4_2_;
    auVar74._4_2_ = auVar34._4_2_ + sVar93;
    sVar60 = auVar103._6_2_;
    auVar74._6_2_ = auVar34._6_2_ + sVar60;
    sVar61 = auVar103._8_2_;
    auVar74._8_2_ = auVar34._8_2_ + sVar61;
    sVar62 = auVar103._10_2_;
    auVar74._10_2_ = auVar34._10_2_ + sVar62;
    sVar63 = auVar103._12_2_;
    auVar74._12_2_ = auVar34._12_2_ + sVar63;
    sVar64 = auVar103._14_2_;
    auVar74._14_2_ = auVar34._14_2_ + sVar64;
    auVar81._0_2_ = auVar47._0_2_ + sVar91;
    auVar81._2_2_ = auVar47._2_2_ + sVar92;
    auVar81._4_2_ = auVar47._4_2_ + sVar93;
    auVar81._6_2_ = auVar47._6_2_ + sVar60;
    auVar81._8_2_ = auVar47._8_2_ + sVar61;
    auVar81._10_2_ = auVar47._10_2_ + sVar62;
    auVar81._12_2_ = auVar47._12_2_ + sVar63;
    auVar81._14_2_ = auVar47._14_2_ + sVar64;
    auVar48._0_2_ = auVar80._0_2_ + sVar91;
    auVar48._2_2_ = auVar80._2_2_ + sVar92;
    auVar48._4_2_ = auVar80._4_2_ + sVar93;
    auVar48._6_2_ = auVar80._6_2_ + sVar60;
    auVar48._8_2_ = auVar80._8_2_ + sVar61;
    auVar48._10_2_ = auVar80._10_2_ + sVar62;
    auVar48._12_2_ = auVar80._12_2_ + sVar63;
    auVar48._14_2_ = auVar80._14_2_ + sVar64;
    auVar94._0_2_ = auVar35._0_2_ + sVar91;
    auVar94._2_2_ = auVar35._2_2_ + sVar92;
    auVar94._4_2_ = auVar35._4_2_ + sVar93;
    auVar94._6_2_ = auVar35._6_2_ + sVar60;
    auVar94._8_2_ = auVar35._8_2_ + sVar61;
    auVar94._10_2_ = auVar35._10_2_ + sVar62;
    auVar94._12_2_ = auVar35._12_2_ + sVar63;
    auVar94._14_2_ = auVar35._14_2_ + sVar64;
    auVar35 = psraw(auVar74,5);
    auVar47 = psraw(auVar81,5);
    auVar80 = psraw(auVar48,5);
    auVar74 = psraw(auVar94,5);
    sVar91 = auVar35._0_2_;
    sVar92 = auVar35._2_2_;
    auVar34[1] = (0 < sVar92) * (sVar92 < 0x100) * auVar35[2] - (0xff < sVar92);
    auVar34[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[0] - (0xff < sVar91);
    sVar91 = auVar35._4_2_;
    auVar34[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[4] - (0xff < sVar91);
    sVar91 = auVar35._6_2_;
    auVar34[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[6] - (0xff < sVar91);
    sVar91 = auVar35._8_2_;
    auVar34[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[8] - (0xff < sVar91);
    sVar91 = auVar35._10_2_;
    auVar34[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[10] - (0xff < sVar91);
    sVar91 = auVar35._12_2_;
    auVar34[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[0xc] - (0xff < sVar91);
    sVar91 = auVar35._14_2_;
    auVar34[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar35[0xe] - (0xff < sVar91);
    auVar34._8_8_ = 0;
    sVar91 = auVar47._0_2_;
    sVar92 = auVar47._2_2_;
    auVar82[1] = (0 < sVar92) * (sVar92 < 0x100) * auVar47[2] - (0xff < sVar92);
    auVar82[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[0] - (0xff < sVar91);
    sVar91 = auVar47._4_2_;
    auVar82[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[4] - (0xff < sVar91);
    sVar91 = auVar47._6_2_;
    auVar82[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[6] - (0xff < sVar91);
    sVar91 = auVar47._8_2_;
    auVar82[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[8] - (0xff < sVar91);
    sVar91 = auVar47._10_2_;
    auVar82[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[10] - (0xff < sVar91);
    sVar91 = auVar47._12_2_;
    auVar82[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[0xc] - (0xff < sVar91);
    sVar91 = auVar47._14_2_;
    auVar82[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar47[0xe] - (0xff < sVar91);
    auVar82._8_8_ = 0;
    sVar91 = auVar80._0_2_;
    sVar92 = auVar80._2_2_;
    auVar49[1] = (0 < sVar92) * (sVar92 < 0x100) * auVar80[2] - (0xff < sVar92);
    auVar49[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[0] - (0xff < sVar91);
    sVar91 = auVar80._4_2_;
    auVar49[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[4] - (0xff < sVar91);
    sVar91 = auVar80._6_2_;
    auVar49[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[6] - (0xff < sVar91);
    sVar91 = auVar80._8_2_;
    auVar49[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[8] - (0xff < sVar91);
    sVar91 = auVar80._10_2_;
    auVar49[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[10] - (0xff < sVar91);
    sVar91 = auVar80._12_2_;
    auVar49[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[0xc] - (0xff < sVar91);
    sVar91 = auVar80._14_2_;
    auVar49[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar80[0xe] - (0xff < sVar91);
    auVar49._8_8_ = 0;
    sVar91 = auVar74._0_2_;
    sVar92 = auVar74._2_2_;
    auVar95[1] = (0 < sVar92) * (sVar92 < 0x100) * auVar74[2] - (0xff < sVar92);
    auVar95[0] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[0] - (0xff < sVar91);
    sVar91 = auVar74._4_2_;
    auVar95[2] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[4] - (0xff < sVar91);
    sVar91 = auVar74._6_2_;
    auVar95[3] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[6] - (0xff < sVar91);
    sVar91 = auVar74._8_2_;
    auVar95[4] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[8] - (0xff < sVar91);
    sVar91 = auVar74._10_2_;
    auVar95[5] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[10] - (0xff < sVar91);
    sVar91 = auVar74._12_2_;
    auVar95[6] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[0xc] - (0xff < sVar91);
    sVar91 = auVar74._14_2_;
    auVar95[7] = (0 < sVar91) * (sVar91 < 0x100) * auVar74[0xe] - (0xff < sVar91);
    auVar95._8_8_ = 0;
    auVar35 = pshufb(auVar34,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar34 = pshufb(auVar82,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar39._0_12_ = auVar35._0_12_;
    auVar39._12_2_ = auVar35._6_2_;
    auVar39._14_2_ = auVar34._6_2_;
    auVar38._12_4_ = auVar39._12_4_;
    auVar38._0_10_ = auVar35._0_10_;
    auVar38._10_2_ = auVar34._4_2_;
    auVar37._10_6_ = auVar38._10_6_;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_2_ = auVar35._4_2_;
    auVar9._4_8_ = auVar37._8_8_;
    auVar9._2_2_ = auVar34._2_2_;
    auVar9._0_2_ = auVar35._2_2_;
    auVar36._0_4_ = CONCAT22(auVar34._0_2_,auVar35._0_2_);
    auVar36._4_12_ = auVar9;
    auVar34 = pshufb(auVar49,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar80 = pshufb(auVar95,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar52._0_12_ = auVar34._0_12_;
    auVar52._12_2_ = auVar34._6_2_;
    auVar52._14_2_ = auVar80._6_2_;
    auVar51._12_4_ = auVar52._12_4_;
    auVar51._0_10_ = auVar34._0_10_;
    auVar51._10_2_ = auVar80._4_2_;
    auVar50._10_6_ = auVar51._10_6_;
    auVar50._0_8_ = auVar34._0_8_;
    auVar50._8_2_ = auVar34._4_2_;
    auVar10._4_8_ = auVar50._8_8_;
    auVar10._2_2_ = auVar80._2_2_;
    auVar10._0_2_ = auVar34._2_2_;
    auVar35._0_8_ = auVar36._0_8_;
    auVar35._8_4_ = auVar9._0_4_;
    auVar35._12_4_ = auVar10._0_4_;
    *(ulong *)pu1_dst = CONCAT44(CONCAT22(auVar80._0_2_,auVar34._0_2_),auVar36._0_4_);
    lVar22 = (long)dst_strd;
    *(long *)(pu1_dst + lVar22) = auVar35._8_8_;
    *(int *)(pu1_dst + lVar22 * 2) = auVar37._8_4_;
    *(int *)(pu1_dst + lVar22 * 2 + 4) = auVar50._8_4_;
    *(undefined4 *)(pu1_dst + lVar22 * 3 + 8) = auVar38._12_4_;
    *(undefined4 *)(pu1_dst + lVar22 * 3 + 0xc) = auVar51._12_4_;
  }
  else {
    auVar34 = ZEXT416(nt * 4 - 2);
    auVar34 = pshuflw(auVar34,auVar34,0);
    lVar22 = (long)dst_strd;
    auVar47 = pmovsxbw(in_XMM2,0x807060504030201);
    lVar24 = 0;
    auVar74 = pmovsxbw(in_XMM8,0x1010101010101010);
    local_90 = pu1_dst;
    for (; lVar24 < nt * 2; lVar24 = lVar24 + 0x10) {
      auVar103._0_2_ = auVar47._0_2_ * auVar80._0_2_;
      sVar93 = auVar47._2_2_;
      auVar103._2_2_ = sVar93 * sVar91;
      sVar61 = auVar47._4_2_;
      auVar103._4_2_ = sVar61 * auVar80._0_2_;
      sVar63 = auVar47._6_2_;
      auVar103._6_2_ = sVar63 * sVar91;
      sVar65 = auVar47._8_2_;
      auVar103._8_2_ = sVar65 * auVar80._0_2_;
      sVar67 = auVar47._10_2_;
      auVar103._10_2_ = sVar67 * sVar91;
      sVar69 = auVar47._12_2_;
      sVar71 = auVar47._14_2_;
      auVar103._12_2_ = sVar69 * auVar80._0_2_;
      auVar103._14_2_ = sVar71 * sVar91;
      auVar83 = auVar103 & _DAT_0016bfa0;
      auVar103 = psraw(auVar103,4);
      auVar103 = auVar103 & _DAT_0016c0f0;
      local_78 = auVar34._0_2_;
      sStack_76 = auVar34._2_2_;
      auVar53 = pmovsxbw(auVar103,0x2020202020202020);
      sVar92 = auVar53._0_2_ - auVar83._0_2_;
      sVar60 = auVar53._2_2_ - auVar83._2_2_;
      sVar62 = auVar53._4_2_ - auVar83._4_2_;
      sVar64 = auVar53._6_2_ - auVar83._6_2_;
      sVar66 = auVar53._8_2_ - auVar83._8_2_;
      uVar8 = CONCAT22(sVar66,sVar64);
      auVar97._0_9_ = (unkuint9)uVar8 << 0x30;
      sVar68 = auVar53._10_2_ - auVar83._10_2_;
      uVar15 = CONCAT24(sVar68,uVar8);
      auVar18._6_5_ = 0;
      auVar18._0_6_ = uVar15;
      auVar98._0_11_ = auVar18 << 0x30;
      sVar70 = auVar53._12_2_ - auVar83._12_2_;
      auVar20._8_5_ = 0;
      auVar20._0_8_ = CONCAT26(sVar70,uVar15);
      auVar118._0_13_ = auVar20 << 0x30;
      sVar72 = auVar53._14_2_ - auVar83._14_2_;
      auVar118._14_2_ =
           (undefined2)
           (CONCAT19(auVar83[7],CONCAT18((char)((ushort)sVar64 >> 8),CONCAT26(sVar70,uVar15))) >>
           0x40);
      auVar118[0xd] = auVar83[6];
      auVar98._12_4_ = (undefined4)(CONCAT37(auVar118._13_3_,CONCAT16((char)sVar64,uVar15)) >> 0x30)
      ;
      auVar98[0xb] = auVar83[5];
      auVar97._10_6_ =
           (undefined6)
           (CONCAT55(auVar98._11_5_,CONCAT14((char)((ushort)sVar62 >> 8),uVar8)) >> 0x20);
      auVar97[9] = auVar83[4];
      auVar96._8_8_ = (undefined8)(CONCAT73(auVar97._9_7_,CONCAT12((char)sVar62,sVar64)) >> 0x10);
      auVar96[7] = auVar83[3];
      auVar96[6] = (char)((ushort)sVar60 >> 8);
      auVar96[5] = auVar83[2];
      auVar96[4] = (char)sVar60;
      auVar96[3] = auVar83[1];
      auVar96[2] = (char)((ushort)sVar92 >> 8);
      auVar96._0_2_ = sVar92;
      auVar111._2_14_ = auVar96._2_14_;
      auVar111[0] = (undefined1)sVar92;
      auVar111[1] = auVar83[0];
      auVar53 = pshuflw(in_XMM5,auVar111,0);
      auVar104._0_4_ = auVar53._0_4_;
      auVar104._4_4_ = auVar104._0_4_;
      auVar104._8_4_ = auVar104._0_4_;
      auVar104._12_4_ = auVar104._0_4_;
      auVar53 = pshuflw(auVar104,auVar111,0xaa);
      uVar101 = auVar53._0_4_;
      auVar53 = pshufhw(auVar53,auVar111,0);
      uVar105 = auVar53._8_4_;
      auVar53 = pshufhw(auVar111,auVar111,0xaa);
      uVar100 = auVar53._8_4_;
      auVar53[1] = auVar83[8];
      auVar53[0] = (char)sVar66;
      auVar53[2] = (char)((ushort)sVar66 >> 8);
      auVar53[3] = auVar83[9];
      auVar53[4] = (char)sVar68;
      auVar53[5] = auVar83[10];
      auVar53[6] = (char)((ushort)sVar68 >> 8);
      auVar53[7] = auVar83[0xb];
      auVar53[8] = (char)sVar70;
      auVar53[9] = auVar83[0xc];
      auVar53[10] = (char)((ushort)sVar70 >> 8);
      auVar53[0xb] = auVar83[0xd];
      auVar53[0xc] = (char)sVar72;
      auVar53[0xd] = auVar83[0xe];
      auVar53[0xe] = (char)((ushort)sVar72 >> 8);
      auVar53[0xf] = auVar83[0xf];
      auVar83 = pshuflw(auVar83,auVar53,0);
      uVar73 = auVar83._0_4_;
      auVar83 = pshuflw(auVar83,auVar53,0xaa);
      uVar46 = auVar83._0_4_;
      auVar99._4_4_ = uVar46;
      auVar99._0_4_ = uVar46;
      auVar99._8_4_ = uVar46;
      auVar99._12_4_ = uVar46;
      auVar83 = pshufhw(auVar83,auVar53,0);
      uVar46 = auVar83._8_4_;
      in_XMM5._4_4_ = uVar46;
      in_XMM5._0_4_ = uVar46;
      in_XMM5._8_4_ = uVar46;
      in_XMM5._12_4_ = uVar46;
      auVar53 = pshufhw(auVar53,auVar53,0xaa);
      uVar46 = auVar53._8_4_;
      auVar83._4_4_ = uVar46;
      auVar83._0_4_ = uVar46;
      auVar83._8_4_ = uVar46;
      auVar83._12_4_ = uVar46;
      lVar29 = (long)(short)(local_78 - auVar103._0_2_);
      lVar25 = (long)(short)(sStack_76 - auVar103._2_2_);
      lVar32 = (long)(short)(local_78 - auVar103._4_2_);
      lVar33 = (long)(short)(sStack_76 - auVar103._6_2_);
      lVar30 = (long)(short)(local_78 - auVar103._8_2_);
      lVar31 = (long)(short)(sStack_76 - auVar103._10_2_);
      lVar26 = (long)(short)(local_78 - auVar103._12_2_);
      lVar27 = (long)(short)(sStack_76 - auVar103._14_2_);
      lVar28 = 0;
      pUVar23 = local_90;
      while( true ) {
        lVar33 = lVar33 + -8;
        lVar32 = lVar32 + -8;
        lVar31 = lVar31 + -8;
        lVar30 = lVar30 + -8;
        lVar29 = lVar29 + -8;
        lVar27 = lVar27 + -8;
        lVar26 = lVar26 + -8;
        lVar25 = lVar25 + -8;
        if (nt <= lVar28) break;
        auVar103 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar29),auVar35);
        auVar111 = pmaddubsw(auVar103,auVar104);
        auVar103 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar25),auVar35);
        auVar2._4_4_ = uVar101;
        auVar2._0_4_ = uVar101;
        auVar2._8_4_ = uVar101;
        auVar2._12_4_ = uVar101;
        auVar118 = pmaddubsw(auVar103,auVar2);
        auVar103 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar32),auVar35);
        auVar3._4_4_ = uVar105;
        auVar3._0_4_ = uVar105;
        auVar3._8_4_ = uVar105;
        auVar3._12_4_ = uVar105;
        auVar103 = pmaddubsw(auVar103,auVar3);
        auVar53 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar33),auVar35);
        auVar4._4_4_ = uVar100;
        auVar4._0_4_ = uVar100;
        auVar4._8_4_ = uVar100;
        auVar4._12_4_ = uVar100;
        auVar53 = pmaddubsw(auVar53,auVar4);
        sVar62 = auVar74._0_2_;
        auVar112._0_2_ = auVar111._0_2_ + sVar62;
        sVar64 = auVar74._2_2_;
        auVar112._2_2_ = auVar111._2_2_ + sVar64;
        sVar66 = auVar74._4_2_;
        auVar112._4_2_ = auVar111._4_2_ + sVar66;
        sVar68 = auVar74._6_2_;
        auVar112._6_2_ = auVar111._6_2_ + sVar68;
        sVar70 = auVar74._8_2_;
        auVar112._8_2_ = auVar111._8_2_ + sVar70;
        sVar72 = auVar74._10_2_;
        auVar112._10_2_ = auVar111._10_2_ + sVar72;
        sVar109 = auVar74._12_2_;
        auVar112._12_2_ = auVar111._12_2_ + sVar109;
        sVar110 = auVar74._14_2_;
        auVar112._14_2_ = auVar111._14_2_ + sVar110;
        auVar119._0_2_ = auVar118._0_2_ + sVar62;
        auVar119._2_2_ = auVar118._2_2_ + sVar64;
        auVar119._4_2_ = auVar118._4_2_ + sVar66;
        auVar119._6_2_ = auVar118._6_2_ + sVar68;
        auVar119._8_2_ = auVar118._8_2_ + sVar70;
        auVar119._10_2_ = auVar118._10_2_ + sVar72;
        auVar119._12_2_ = auVar118._12_2_ + sVar109;
        auVar119._14_2_ = auVar118._14_2_ + sVar110;
        auVar111 = psraw(auVar112,5);
        auVar118 = psraw(auVar119,5);
        sVar92 = auVar111._0_2_;
        sVar60 = auVar111._2_2_;
        auVar113[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar111[2] - (0xff < sVar60);
        auVar113[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[0] - (0xff < sVar92);
        sVar92 = auVar111._4_2_;
        auVar113[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[4] - (0xff < sVar92);
        sVar92 = auVar111._6_2_;
        auVar113[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[6] - (0xff < sVar92);
        sVar92 = auVar111._8_2_;
        auVar113[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[8] - (0xff < sVar92);
        sVar92 = auVar111._10_2_;
        auVar113[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[10] - (0xff < sVar92);
        sVar92 = auVar111._12_2_;
        auVar113[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[0xc] - (0xff < sVar92);
        sVar92 = auVar111._14_2_;
        auVar113[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar111[0xe] - (0xff < sVar92);
        auVar113._8_8_ = 0;
        sVar92 = auVar118._0_2_;
        sVar60 = auVar118._2_2_;
        auVar120[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar118[2] - (0xff < sVar60);
        auVar120[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0] - (0xff < sVar92);
        sVar92 = auVar118._4_2_;
        auVar120[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[4] - (0xff < sVar92);
        sVar92 = auVar118._6_2_;
        auVar120[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[6] - (0xff < sVar92);
        sVar92 = auVar118._8_2_;
        auVar120[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[8] - (0xff < sVar92);
        sVar92 = auVar118._10_2_;
        auVar120[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[10] - (0xff < sVar92);
        sVar92 = auVar118._12_2_;
        auVar120[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xc] - (0xff < sVar92);
        sVar92 = auVar118._14_2_;
        auVar120[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xe] - (0xff < sVar92);
        auVar120._8_8_ = 0;
        auVar111 = pshufb(auVar113,(undefined1  [16])aUVar21);
        auVar118 = pshufb(auVar120,(undefined1  [16])aUVar21);
        auVar117._0_12_ = auVar111._0_12_;
        auVar117._12_2_ = auVar111._6_2_;
        auVar117._14_2_ = auVar118._6_2_;
        auVar116._12_4_ = auVar117._12_4_;
        auVar116._0_10_ = auVar111._0_10_;
        auVar116._10_2_ = auVar118._4_2_;
        auVar115._10_6_ = auVar116._10_6_;
        auVar115._0_8_ = auVar111._0_8_;
        auVar115._8_2_ = auVar111._4_2_;
        auVar11._4_8_ = auVar115._8_8_;
        auVar11._2_2_ = auVar118._2_2_;
        auVar11._0_2_ = auVar111._2_2_;
        auVar114._0_4_ = CONCAT22(auVar118._0_2_,auVar111._0_2_);
        auVar114._4_12_ = auVar11;
        auVar54._0_2_ = auVar103._0_2_ + sVar62;
        auVar54._2_2_ = auVar103._2_2_ + sVar64;
        auVar54._4_2_ = auVar103._4_2_ + sVar66;
        auVar54._6_2_ = auVar103._6_2_ + sVar68;
        auVar54._8_2_ = auVar103._8_2_ + sVar70;
        auVar54._10_2_ = auVar103._10_2_ + sVar72;
        auVar54._12_2_ = auVar103._12_2_ + sVar109;
        auVar54._14_2_ = auVar103._14_2_ + sVar110;
        auVar84._0_2_ = auVar53._0_2_ + sVar62;
        auVar84._2_2_ = auVar53._2_2_ + sVar64;
        auVar84._4_2_ = auVar53._4_2_ + sVar66;
        auVar84._6_2_ = auVar53._6_2_ + sVar68;
        auVar84._8_2_ = auVar53._8_2_ + sVar70;
        auVar84._10_2_ = auVar53._10_2_ + sVar72;
        auVar84._12_2_ = auVar53._12_2_ + sVar109;
        auVar84._14_2_ = auVar53._14_2_ + sVar110;
        auVar103 = psraw(auVar54,5);
        auVar53 = psraw(auVar84,5);
        sVar92 = auVar103._0_2_;
        sVar60 = auVar103._2_2_;
        auVar55[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar103[2] - (0xff < sVar60);
        auVar55[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0] - (0xff < sVar92);
        sVar92 = auVar103._4_2_;
        auVar55[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[4] - (0xff < sVar92);
        sVar92 = auVar103._6_2_;
        auVar55[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[6] - (0xff < sVar92);
        sVar92 = auVar103._8_2_;
        auVar55[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[8] - (0xff < sVar92);
        sVar92 = auVar103._10_2_;
        auVar55[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[10] - (0xff < sVar92);
        sVar92 = auVar103._12_2_;
        auVar55[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xc] - (0xff < sVar92);
        sVar92 = auVar103._14_2_;
        auVar55[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xe] - (0xff < sVar92);
        auVar55._8_8_ = 0;
        sVar92 = auVar53._0_2_;
        sVar60 = auVar53._2_2_;
        auVar85[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar53[2] - (0xff < sVar60);
        auVar85[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[0] - (0xff < sVar92);
        sVar92 = auVar53._4_2_;
        auVar85[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[4] - (0xff < sVar92);
        sVar92 = auVar53._6_2_;
        auVar85[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[6] - (0xff < sVar92);
        sVar92 = auVar53._8_2_;
        auVar85[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[8] - (0xff < sVar92);
        sVar92 = auVar53._10_2_;
        auVar85[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[10] - (0xff < sVar92);
        sVar92 = auVar53._12_2_;
        auVar85[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[0xc] - (0xff < sVar92);
        sVar92 = auVar53._14_2_;
        auVar85[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar53[0xe] - (0xff < sVar92);
        auVar85._8_8_ = 0;
        auVar53 = pshufb(auVar55,(undefined1  [16])aUVar21);
        auVar111 = pshufb(auVar85,(undefined1  [16])aUVar21);
        auVar58._0_12_ = auVar53._0_12_;
        auVar58._12_2_ = auVar53._6_2_;
        auVar58._14_2_ = auVar111._6_2_;
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._0_10_ = auVar53._0_10_;
        auVar57._10_2_ = auVar111._4_2_;
        auVar56._10_6_ = auVar57._10_6_;
        auVar56._0_8_ = auVar53._0_8_;
        auVar56._8_2_ = auVar53._4_2_;
        auVar12._4_8_ = auVar56._8_8_;
        auVar12._2_2_ = auVar111._2_2_;
        auVar12._0_2_ = auVar53._2_2_;
        auVar103 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar30),auVar35);
        auVar5._4_4_ = uVar73;
        auVar5._0_4_ = uVar73;
        auVar5._8_4_ = uVar73;
        auVar5._12_4_ = uVar73;
        auVar103 = pmaddubsw(auVar103,auVar5);
        auVar118 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar31),auVar35);
        auVar118 = pmaddubsw(auVar118,auVar99);
        auVar40._0_2_ = auVar103._0_2_ + sVar62;
        auVar40._2_2_ = auVar103._2_2_ + sVar64;
        auVar40._4_2_ = auVar103._4_2_ + sVar66;
        auVar40._6_2_ = auVar103._6_2_ + sVar68;
        auVar40._8_2_ = auVar103._8_2_ + sVar70;
        auVar40._10_2_ = auVar103._10_2_ + sVar72;
        auVar40._12_2_ = auVar103._12_2_ + sVar109;
        auVar40._14_2_ = auVar103._14_2_ + sVar110;
        auVar121._0_2_ = auVar118._0_2_ + sVar62;
        auVar121._2_2_ = auVar118._2_2_ + sVar64;
        auVar121._4_2_ = auVar118._4_2_ + sVar66;
        auVar121._6_2_ = auVar118._6_2_ + sVar68;
        auVar121._8_2_ = auVar118._8_2_ + sVar70;
        auVar121._10_2_ = auVar118._10_2_ + sVar72;
        auVar121._12_2_ = auVar118._12_2_ + sVar109;
        auVar121._14_2_ = auVar118._14_2_ + sVar110;
        auVar103 = psraw(auVar40,5);
        auVar118 = psraw(auVar121,5);
        sVar92 = auVar103._0_2_;
        sVar60 = auVar103._2_2_;
        auVar41[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar103[2] - (0xff < sVar60);
        auVar41[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0] - (0xff < sVar92);
        sVar92 = auVar103._4_2_;
        auVar41[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[4] - (0xff < sVar92);
        sVar92 = auVar103._6_2_;
        auVar41[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[6] - (0xff < sVar92);
        sVar92 = auVar103._8_2_;
        auVar41[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[8] - (0xff < sVar92);
        sVar92 = auVar103._10_2_;
        auVar41[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[10] - (0xff < sVar92);
        sVar92 = auVar103._12_2_;
        auVar41[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xc] - (0xff < sVar92);
        sVar92 = auVar103._14_2_;
        auVar41[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xe] - (0xff < sVar92);
        auVar41._8_8_ = 0;
        sVar92 = auVar118._0_2_;
        sVar60 = auVar118._2_2_;
        auVar122[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar118[2] - (0xff < sVar60);
        auVar122[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0] - (0xff < sVar92);
        sVar92 = auVar118._4_2_;
        auVar122[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[4] - (0xff < sVar92);
        sVar92 = auVar118._6_2_;
        auVar122[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[6] - (0xff < sVar92);
        sVar92 = auVar118._8_2_;
        auVar122[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[8] - (0xff < sVar92);
        sVar92 = auVar118._10_2_;
        auVar122[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[10] - (0xff < sVar92);
        sVar92 = auVar118._12_2_;
        auVar122[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xc] - (0xff < sVar92);
        sVar92 = auVar118._14_2_;
        auVar122[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xe] - (0xff < sVar92);
        auVar122._8_8_ = 0;
        auVar103 = pshufb(auVar41,(undefined1  [16])aUVar21);
        auVar118 = pshufb(auVar122,(undefined1  [16])aUVar21);
        auVar45._0_12_ = auVar103._0_12_;
        auVar45._12_2_ = auVar103._6_2_;
        auVar45._14_2_ = auVar118._6_2_;
        auVar44._12_4_ = auVar45._12_4_;
        auVar44._0_10_ = auVar103._0_10_;
        auVar44._10_2_ = auVar118._4_2_;
        auVar43._10_6_ = auVar44._10_6_;
        auVar43._0_8_ = auVar103._0_8_;
        auVar43._8_2_ = auVar103._4_2_;
        auVar13._4_8_ = auVar43._8_8_;
        auVar13._2_2_ = auVar118._2_2_;
        auVar13._0_2_ = auVar103._2_2_;
        auVar42._0_4_ = CONCAT22(auVar118._0_2_,auVar103._0_2_);
        auVar42._4_12_ = auVar13;
        auVar103 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar26),auVar35);
        auVar103 = pmaddubsw(auVar103,in_XMM5);
        auVar118 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar27),auVar35);
        auVar118 = pmaddubsw(auVar118,auVar83);
        auVar86._0_2_ = auVar103._0_2_ + sVar62;
        auVar86._2_2_ = auVar103._2_2_ + sVar64;
        auVar86._4_2_ = auVar103._4_2_ + sVar66;
        auVar86._6_2_ = auVar103._6_2_ + sVar68;
        auVar86._8_2_ = auVar103._8_2_ + sVar70;
        auVar86._10_2_ = auVar103._10_2_ + sVar72;
        auVar86._12_2_ = auVar103._12_2_ + sVar109;
        auVar86._14_2_ = auVar103._14_2_ + sVar110;
        auVar123._0_2_ = auVar118._0_2_ + sVar62;
        auVar123._2_2_ = auVar118._2_2_ + sVar64;
        auVar123._4_2_ = auVar118._4_2_ + sVar66;
        auVar123._6_2_ = auVar118._6_2_ + sVar68;
        auVar123._8_2_ = auVar118._8_2_ + sVar70;
        auVar123._10_2_ = auVar118._10_2_ + sVar72;
        auVar123._12_2_ = auVar118._12_2_ + sVar109;
        auVar123._14_2_ = auVar118._14_2_ + sVar110;
        auVar103 = psraw(auVar86,5);
        auVar118 = psraw(auVar123,5);
        sVar92 = auVar103._0_2_;
        sVar60 = auVar103._2_2_;
        auVar87[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar103[2] - (0xff < sVar60);
        auVar87[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0] - (0xff < sVar92);
        sVar92 = auVar103._4_2_;
        auVar87[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[4] - (0xff < sVar92);
        sVar92 = auVar103._6_2_;
        auVar87[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[6] - (0xff < sVar92);
        sVar92 = auVar103._8_2_;
        auVar87[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[8] - (0xff < sVar92);
        sVar92 = auVar103._10_2_;
        auVar87[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[10] - (0xff < sVar92);
        sVar92 = auVar103._12_2_;
        auVar87[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xc] - (0xff < sVar92);
        sVar92 = auVar103._14_2_;
        auVar87[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar103[0xe] - (0xff < sVar92);
        auVar87._8_8_ = 0;
        sVar92 = auVar118._0_2_;
        sVar60 = auVar118._2_2_;
        auVar124[1] = (0 < sVar60) * (sVar60 < 0x100) * auVar118[2] - (0xff < sVar60);
        auVar124[0] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0] - (0xff < sVar92);
        sVar92 = auVar118._4_2_;
        auVar124[2] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[4] - (0xff < sVar92);
        sVar92 = auVar118._6_2_;
        auVar124[3] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[6] - (0xff < sVar92);
        sVar92 = auVar118._8_2_;
        auVar124[4] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[8] - (0xff < sVar92);
        sVar92 = auVar118._10_2_;
        auVar124[5] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[10] - (0xff < sVar92);
        sVar92 = auVar118._12_2_;
        auVar124[6] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xc] - (0xff < sVar92);
        sVar92 = auVar118._14_2_;
        auVar124[7] = (0 < sVar92) * (sVar92 < 0x100) * auVar118[0xe] - (0xff < sVar92);
        auVar124._8_8_ = 0;
        auVar103 = pshufb(auVar87,(undefined1  [16])aUVar21);
        auVar118 = pshufb(auVar124,(undefined1  [16])aUVar21);
        auVar90._0_12_ = auVar103._0_12_;
        auVar90._12_2_ = auVar103._6_2_;
        auVar90._14_2_ = auVar118._6_2_;
        auVar89._12_4_ = auVar90._12_4_;
        auVar89._0_10_ = auVar103._0_10_;
        auVar89._10_2_ = auVar118._4_2_;
        auVar88._10_6_ = auVar89._10_6_;
        auVar88._0_8_ = auVar103._0_8_;
        auVar88._8_2_ = auVar103._4_2_;
        auVar14._4_8_ = auVar88._8_8_;
        auVar14._2_2_ = auVar118._2_2_;
        auVar14._0_2_ = auVar103._2_2_;
        auVar125._0_8_ = auVar114._0_8_;
        auVar125._8_4_ = auVar11._0_4_;
        auVar125._12_4_ = auVar12._0_4_;
        auVar59._0_8_ = auVar42._0_8_;
        auVar59._8_4_ = auVar13._0_4_;
        auVar59._12_4_ = auVar14._0_4_;
        *(ulong *)pUVar23 = CONCAT44(CONCAT22(auVar111._0_2_,auVar53._0_2_),auVar114._0_4_);
        *(ulong *)(pUVar23 + 8) = CONCAT44(CONCAT22(auVar118._0_2_,auVar103._0_2_),auVar42._0_4_);
        *(long *)(pUVar23 + lVar22) = auVar125._8_8_;
        *(long *)(pUVar23 + lVar22 + 8) = auVar59._8_8_;
        pUVar1 = pUVar23 + lVar22 * 2;
        *(int *)pUVar1 = auVar115._8_4_;
        *(int *)(pUVar1 + 4) = auVar56._8_4_;
        *(int *)(pUVar1 + 8) = auVar43._8_4_;
        *(int *)(pUVar1 + 0xc) = auVar88._8_4_;
        *(undefined4 *)(pUVar23 + lVar22 * 3 + 8) = auVar116._12_4_;
        *(undefined4 *)(pUVar23 + lVar22 * 3 + 0xc) = auVar57._12_4_;
        *(undefined4 *)(pUVar23 + lVar22 * 3 + 0x10) = auVar44._12_4_;
        *(undefined4 *)(pUVar23 + lVar22 * 3 + 0x14) = auVar89._12_4_;
        lVar28 = lVar28 + 4;
        pUVar23 = pUVar23 + lVar22 * 4;
      }
      auVar47._0_2_ = auVar47._0_2_ + 8;
      auVar47._2_2_ = sVar93 + 8;
      auVar47._4_2_ = sVar61 + 8;
      auVar47._6_2_ = sVar63 + 8;
      auVar47._8_2_ = sVar65 + 8;
      auVar47._10_2_ = sVar67 + 8;
      auVar47._12_2_ = sVar69 + 8;
      auVar47._14_2_ = sVar71 + 8;
      local_90 = local_90 + 0x10;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3(UWORD8 *pu1_ref,
                                               WORD32 src_strd,
                                               UWORD8 *pu1_dst,
                                               WORD32 dst_strd,
                                               WORD32 nt,
                                               WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang;

    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, zero_8x16b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm1;
    UNUSED(src_strd);

    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY7[0]);
    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi16(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(1);

    zero_8x16b = _mm_set1_epi16(0);


    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(4);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storel_epi64((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storel_epi64((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 8)); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 8)); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 8)); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 8)); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 0)), src_temp8_8x16b);             /* row=0*/

                src_temp2_8x16b  = _mm_shuffle_epi32(src_temp8_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (1))), src_temp2_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (2))), src_temp7_8x16b);       /* row=2*/

                src_temp4_8x16b  = _mm_shuffle_epi32(src_temp7_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (3))), src_temp4_8x16b);       /* row=4*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        for(col = 0; col < 2 * nt; col += 16)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i fract5_8x16b, fract6_8x16b, fract7_8x16b, fract8_8x16b, src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storeu_si128((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storeu_si128((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            fract5_8x16b = _mm_set1_epi8(ai1_fract_temp_val[8]);  /* col=5*/
            fract6_8x16b = _mm_set1_epi8(ai1_fract_temp_val[10]);  /* col=6*/
            fract7_8x16b = _mm_set1_epi8(ai1_fract_temp_val[12]);  /* col=7*/
            fract8_8x16b = _mm_set1_epi8(ai1_fract_temp_val[14]);  /* col=8*/

            temp11_8x16b = _mm_set1_epi8(ai1_src_temp_val[8]);  /* col=0*/
            temp12_8x16b = _mm_set1_epi8(ai1_src_temp_val[10]);  /* col=1*/
            temp13_8x16b = _mm_set1_epi8(ai1_src_temp_val[12]);  /* col=2*/
            temp14_8x16b = _mm_set1_epi8(ai1_src_temp_val[14]);  /* col=3*/

            temp11_8x16b = _mm_unpacklo_epi8(temp11_8x16b, fract5_8x16b);
            temp12_8x16b = _mm_unpacklo_epi8(temp12_8x16b, fract6_8x16b);
            temp13_8x16b = _mm_unpacklo_epi8(temp13_8x16b, fract7_8x16b);
            temp14_8x16b = _mm_unpacklo_epi8(temp14_8x16b, fract8_8x16b);

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 4)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - row - (8 + row))); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - row - (8 + row))); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - row - (8 + row))); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - row - (8 + row))); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp15_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - row - row - 8)); /* col=5*/
                src_temp16_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - row - row - 8)); /* col=6*/
                src_temp17_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - row - row - 8)); /* col=7*/
                src_temp18_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - row - row - 8)); /* col=8*/

                src_temp11_8x16b = _mm_srli_si128(src_temp15_8x16b, 2); /* col=5*/
                src_temp12_8x16b = _mm_srli_si128(src_temp16_8x16b, 2); /* col=6*/
                src_temp13_8x16b = _mm_srli_si128(src_temp17_8x16b, 2); /* col=7*/
                src_temp14_8x16b = _mm_srli_si128(src_temp18_8x16b, 2); /* col=8*/

                src_temp11_8x16b =  _mm_unpacklo_epi8(src_temp11_8x16b, src_temp15_8x16b); /* col=0*/
                src_temp12_8x16b =  _mm_unpacklo_epi8(src_temp12_8x16b, src_temp16_8x16b); /* col=1*/
                src_temp13_8x16b =  _mm_unpacklo_epi8(src_temp13_8x16b, src_temp17_8x16b); /* col=2*/
                src_temp14_8x16b =  _mm_unpacklo_epi8(src_temp14_8x16b, src_temp18_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, zero_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, zero_8x16b); /* col=6*/
                src_temp13_8x16b = _mm_packus_epi16(src_temp13_8x16b, zero_8x16b); /* col=7*/
                src_temp14_8x16b = _mm_packus_epi16(src_temp14_8x16b, zero_8x16b); /* col=8*/

                src_temp11_8x16b = _mm_shuffle_epi8(src_temp11_8x16b, sm1);
                src_temp12_8x16b = _mm_shuffle_epi8(src_temp12_8x16b, sm1);
                src_temp13_8x16b = _mm_shuffle_epi8(src_temp13_8x16b, sm1);
                src_temp14_8x16b = _mm_shuffle_epi8(src_temp14_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi16(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpacklo_epi16(src_temp13_8x16b, src_temp14_8x16b);

                src_temp18_8x16b = _mm_unpacklo_epi32(src_temp15_8x16b, src_temp16_8x16b);
                src_temp17_8x16b = _mm_unpackhi_epi32(src_temp15_8x16b, src_temp16_8x16b);

                src_temp11_8x16b = _mm_unpacklo_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp12_8x16b = _mm_unpackhi_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp13_8x16b = _mm_unpacklo_epi64(src_temp7_8x16b, src_temp17_8x16b);
                src_temp14_8x16b = _mm_unpackhi_epi64(src_temp7_8x16b, src_temp17_8x16b);

                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * row)),    src_temp11_8x16b);          /* row=0*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp12_8x16b);       /* row=1*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp13_8x16b);       /* row=2*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp14_8x16b);       /* row=4*/

            }
        }
    }
}